

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hmac.c
# Opt level: O0

ssh2_mac * hmac_new(ssh2_macalg *alg,ssh_cipher *cipher)

{
  undefined8 *puVar1;
  long *plVar2;
  ssh_hash *psVar3;
  ssh_hashalg *psVar4;
  void *pvVar5;
  strbuf *psVar6;
  char *local_30;
  char *sep;
  hmac_extra *extra;
  hmac *ctx;
  ssh_cipher *cipher_local;
  ssh2_macalg *alg_local;
  
  plVar2 = (long *)safemalloc(1,0x40,0);
  puVar1 = (undefined8 *)alg->extra;
  psVar3 = ssh_hash_new((ssh_hashalg *)*puVar1);
  plVar2[1] = (long)psVar3;
  psVar4 = ssh_hash_alg((ssh_hash *)plVar2[1]);
  *plVar2 = (long)psVar4;
  psVar3 = ssh_hash_new((ssh_hashalg *)*plVar2);
  plVar2[2] = (long)psVar3;
  psVar3 = ssh_hash_new((ssh_hashalg *)*plVar2);
  plVar2[3] = (long)psVar3;
  if (*(long *)(*plVar2 + 0x30) != 0) {
    pvVar5 = safemalloc(*(size_t *)(*plVar2 + 0x28),1,0);
    plVar2[4] = (long)pvVar5;
    psVar6 = strbuf_new();
    plVar2[5] = (long)psVar6;
    BinarySink_put_fmt((BinarySink *)(plVar2[5] + 0x18),"HMAC-%s%s",*(undefined8 *)(*plVar2 + 0x38),
                       puVar1[1]);
    if ((puVar1[2] != 0) || (*(long *)(*plVar2 + 0x40) != 0)) {
      BinarySink_put_fmt((BinarySink *)(plVar2[5] + 0x18)," (");
      local_30 = "";
      if (puVar1[2] != 0) {
        BinarySink_put_fmt((BinarySink *)(plVar2[5] + 0x18),"%s%s","",puVar1[2]);
        local_30 = ", ";
      }
      if (*(long *)(*plVar2 + 0x40) != 0) {
        BinarySink_put_fmt((BinarySink *)(plVar2[5] + 0x18),"%s%s",local_30,
                           *(undefined8 *)(*plVar2 + 0x40));
      }
      BinarySink_put_fmt((BinarySink *)(plVar2[5] + 0x18),")");
    }
    plVar2[6] = (long)alg;
    plVar2[7] = *(long *)(plVar2[3] + 8);
    return (ssh2_mac *)(plVar2 + 6);
  }
  __assert_fail("ctx->hashalg->blocklen",
                "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/crypto/hmac.c",
                0x28,"ssh2_mac *hmac_new(const ssh2_macalg *, ssh_cipher *)");
}

Assistant:

static ssh2_mac *hmac_new(const ssh2_macalg *alg, ssh_cipher *cipher)
{
    struct hmac *ctx = snew(struct hmac);
    const struct hmac_extra *extra = (const struct hmac_extra *)alg->extra;

    ctx->h_outer = ssh_hash_new(extra->hashalg_base);
    /* In case that hashalg was a selector vtable, we'll now switch to
     * using whatever real one it selected, for all future purposes. */
    ctx->hashalg = ssh_hash_alg(ctx->h_outer);
    ctx->h_inner = ssh_hash_new(ctx->hashalg);
    ctx->h_live = ssh_hash_new(ctx->hashalg);

    /*
     * HMAC is not well defined as a wrapper on an absolutely general
     * hash function; it expects that the function it's wrapping will
     * consume data in fixed-size blocks, and it's partially defined
     * in terms of that block size. So we insist that the hash we're
     * given must have defined a meaningful block size.
     */
    assert(ctx->hashalg->blocklen);

    ctx->digest = snewn(ctx->hashalg->hlen, uint8_t);

    ctx->text_name = strbuf_new();
    put_fmt(ctx->text_name, "HMAC-%s%s",
            ctx->hashalg->text_basename, extra->suffix);
    if (extra->annotation || ctx->hashalg->annotation) {
        put_fmt(ctx->text_name, " (");
        const char *sep = "";
        if (extra->annotation) {
            put_fmt(ctx->text_name, "%s%s", sep, extra->annotation);
            sep = ", ";
        }
        if (ctx->hashalg->annotation) {
            put_fmt(ctx->text_name, "%s%s", sep, ctx->hashalg->annotation);
            sep = ", ";
        }
        put_fmt(ctx->text_name, ")");
    }

    ctx->mac.vt = alg;
    BinarySink_DELEGATE_INIT(&ctx->mac, ctx->h_live);

    return &ctx->mac;
}